

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O1

void __thiscall spvtools::utils::BitVector::ReportDensity(BitVector *this,ostream *out)

{
  bool bVar1;
  ulong *puVar2;
  ostream *poVar3;
  long lVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  uVar5 = 0;
  for (puVar2 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    uVar6 = *puVar2;
    if (uVar6 != 0) {
      do {
        uVar5 = uVar5 + ((uint)uVar6 & 1);
        bVar1 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"count=",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", total size (bytes)=",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", bytes per element=",0x14);
  lVar4 = (long)(this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / (double)uVar5);
  return;
}

Assistant:

void BitVector::ReportDensity(std::ostream& out) {
  uint32_t count = 0;

  for (BitContainer e : bits_) {
    while (e != 0) {
      if ((e & 1) != 0) {
        ++count;
      }
      e = e >> 1;
    }
  }

  out << "count=" << count
      << ", total size (bytes)=" << bits_.size() * sizeof(BitContainer)
      << ", bytes per element="
      << (double)(bits_.size() * sizeof(BitContainer)) / (double)(count);
}